

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

FileId decompress_single(uint8_t **ptrptr)

{
  uint64_t acc;
  uint8_t **ptr;
  uint32_t shift;
  uint8_t **ptrptr_local;
  
  shift = 0;
  acc = 0;
  while (acc = ((**ptrptr & 0x7f) << ((byte)shift & 0x1f)) + acc, (**ptrptr & 0x80) != 0) {
    shift = shift + 7;
    *ptrptr = *ptrptr + 1;
  }
  *ptrptr = *ptrptr + 1;
  return (FileId)acc;
}

Assistant:

FileId decompress_single(uint8_t **ptrptr) {
    uint32_t shift = 0;
    uint8_t *&ptr = *ptrptr;
    for (uint64_t acc = 0;; ptr++) {
        acc += (*ptr & 0x7FU) << shift;
        if ((*ptr & 0x80U) == 0) {
            ptr++;
            return acc;
        }
        shift += 7U;
    }
}